

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  OutputDeclaration *pOVar3;
  mapped_type *pmVar4;
  Identifier IVar5;
  string_view newString;
  vector<soul::Type,_std::allocator<soul::Type>_> local_58;
  vector<soul::Type,_std::allocator<soul::Type>_> local_38;
  
  pOVar3 = PoolAllocator::allocate<soul::heart::OutputDeclaration,soul::CodeLocation_const&>
                     (&this->newModule->allocator->pool,(CodeLocation *)(__fn + 8));
  local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)__fn;
  pmVar4 = std::__detail::
           _Map_base<soul::pool_ref<const_soul::heart::OutputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::OutputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->outputMappings,(key_type *)&local_58);
  if (pmVar4->object == (OutputDeclaration *)0x0) {
    pmVar4->object = pOVar3;
    puVar1 = *(undefined8 **)(__fn + 0x18);
    if (puVar1 == (undefined8 *)0x0) {
      IVar5.name = (string *)0x0;
    }
    else {
      newString._M_str = (char *)*puVar1;
      newString._M_len = puVar1[1];
      IVar5 = Identifier::Pool::get(&this->newModule->allocator->identifiers,newString);
    }
    (pOVar3->super_IODeclaration).name.name = IVar5.name;
    uVar2 = *(undefined8 *)(__fn + 0x20);
    (pOVar3->super_IODeclaration).index = (int)uVar2;
    (pOVar3->super_IODeclaration).endpointType = (int)((ulong)uVar2 >> 0x20);
    cloneTypes(&local_38,this,*(ArrayView<soul::Type> *)(__fn + 0x28));
    local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pOVar3->super_IODeclaration).dataTypes.
         super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    (pOVar3->super_IODeclaration).dataTypes.
    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pOVar3->super_IODeclaration).dataTypes.
         super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pOVar3->super_IODeclaration).dataTypes.
         super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    (pOVar3->super_IODeclaration).dataTypes.
    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
    _M_start = local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
    (pOVar3->super_IODeclaration).dataTypes.
    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_58);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
    Annotation::operator=(&(pOVar3->super_IODeclaration).annotation,(Annotation *)(__fn + 0x48));
    (pOVar3->super_IODeclaration).arraySize.super__Optional_base<unsigned_int,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_int> =
         *(_Optional_payload_base<unsigned_int> *)(__fn + 0x40);
    return (int)pOVar3;
  }
  throwInternalCompilerError("mapping == nullptr","clone",0xc3);
}

Assistant:

heart::OutputDeclaration& clone (const heart::OutputDeclaration& old)
    {
        auto& io = newModule.allocate<heart::OutputDeclaration> (old.location);
        auto& mapping = outputMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        mapping = io;
        io.name = newModule.allocator.get (old.name);
        io.index = old.index;
        io.endpointType = old.endpointType;
        io.dataTypes = cloneTypes (old.dataTypes);
        io.annotation = old.annotation;
        io.arraySize = old.arraySize;
        return io;
    }